

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_ECC_PARMS_Unmarshal(TPMS_ECC_PARMS *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPMT_SYM_DEF_OBJECT_Unmarshal(&target->symmetric,buffer,size,1);
  if (TVar1 == 0) {
    TVar1 = TPMT_ECC_SCHEME_Unmarshal(&target->scheme,buffer,size,1);
    if (TVar1 == 0) {
      TVar1 = TPMI_ECC_CURVE_Unmarshal(&target->curveID,buffer,size);
      if (TVar1 == 0) {
        TVar1 = TPMT_KDF_SCHEME_Unmarshal(&target->kdf,buffer,size,1);
        return TVar1;
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_ECC_PARMS_Unmarshal(TPMS_ECC_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMT_SYM_DEF_OBJECT_Unmarshal((TPMT_SYM_DEF_OBJECT *)&(target->symmetric), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_ECC_SCHEME_Unmarshal((TPMT_ECC_SCHEME *)&(target->scheme), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ECC_CURVE_Unmarshal((TPMI_ECC_CURVE *)&(target->curveID), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_KDF_SCHEME_Unmarshal((TPMT_KDF_SCHEME *)&(target->kdf), buffer, size, 1);
    return result;
}